

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::
     throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,char_const*>
               (char *args,path *args_1,char *args_2,char *args_3)

{
  Exception *this;
  string local_210;
  path local_1e0;
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*> local_1b1
  ;
  stringstream local_1b0 [8];
  stringstream msg;
  char *args_local_3;
  char *args_local_2;
  path *args_local_1;
  char *args_local;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Catch::clara::std::filesystem::__cxx11::path::path(&local_1e0,(path *)args_1);
  detail::make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>::
  operator()(&local_1b1,(stringstream *)local_1b0,args,(path *)&local_1e0,args_2,args_3);
  Catch::clara::std::filesystem::__cxx11::path::~path(&local_1e0);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_210);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}